

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

int64_t __thiscall
wallet::CWallet::RescanFromTime
          (CWallet *this,int64_t startTime,WalletRescanReserver *reserver,bool update)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  Chain *pCVar4;
  bool *params_1;
  FoundBlock *pFVar5;
  byte in_CL;
  char *in_RDX;
  bool *in_RSI;
  long in_FS_OFFSET;
  bool start;
  int64_t time_max;
  int start_height;
  bool in_stack_000000de;
  bool in_stack_000000df;
  WalletRescanReserver *in_stack_000000e0;
  int in_stack_000000ec;
  uint256 *in_stack_000000f0;
  CWallet *in_stack_000000f8;
  ScanResult result;
  uint256 start_block;
  _Optional_payload_base<int> in_stack_00000378;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe54;
  CWallet *in_stack_fffffffffffffe58;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffe68;
  undefined1 *puVar7;
  char *params;
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  bool *local_148;
  ConstevalFormatString<2U> in_stack_fffffffffffffec8;
  undefined1 local_120 [88];
  undefined1 local_c8 [84];
  int local_74;
  undefined1 auStack_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  pCVar4 = chain(in_stack_fffffffffffffe58);
  params_1 = in_RSI + -0x1c20;
  memset(local_c8,0,0x50);
  interfaces::FoundBlock::FoundBlock
            ((FoundBlock *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  interfaces::FoundBlock::hash
            ((FoundBlock *)in_stack_fffffffffffffe58,
             (uint256 *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  pFVar5 = interfaces::FoundBlock::height
                     ((FoundBlock *)in_stack_fffffffffffffe58,
                      (int *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  uVar3 = (*pCVar4->_vptr_Chain[0xb])(pCVar4,params_1,0,pFVar5);
  bVar2 = (byte)uVar3 & 1;
  params = "%s: Rescanning last %i blocks\n";
  if ((uVar3 & 1) != 0) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    RescanFromTime::anon_class_8_1_8991fb9c::operator()(in_stack_fffffffffffffe68);
  }
  WalletLogPrintf<char[15],int>
            ((CWallet *)
             CONCAT17(bVar1,CONCAT16(bVar2,CONCAT24(in_stack_fffffffffffffe9c,
                                                    in_stack_fffffffffffffe98))),
             in_stack_fffffffffffffec8,(char (*) [15])params,(int *)params_1);
  local_148 = in_RSI;
  if ((bVar2 & 1) != 0) {
    std::optional<int>::optional
              ((optional<int> *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    uVar3 = (uint)(bVar1 & 1);
    uVar6 = 0;
    ScanForWalletTransactions
              (in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,
               (optional<int>)in_stack_00000378,in_stack_000000e0,in_stack_000000df,
               in_stack_000000de);
    local_148 = in_RSI;
    if (local_74 == 1) {
      pCVar4 = chain(in_stack_fffffffffffffe58);
      puVar7 = auStack_48;
      memset(local_120,0,0x50);
      interfaces::FoundBlock::FoundBlock((FoundBlock *)CONCAT44(in_stack_fffffffffffffe4c,uVar3));
      pFVar5 = interfaces::FoundBlock::maxTime
                         ((FoundBlock *)in_stack_fffffffffffffe58,
                          (int64_t *)CONCAT44(in_stack_fffffffffffffe54,uVar6));
      (*pCVar4->_vptr_Chain[10])(pCVar4,puVar7,pFVar5);
      inline_check_non_fatal<bool>
                (in_RSI,in_RDX,CONCAT13(bVar1,CONCAT12(bVar2,in_stack_fffffffffffffe9c)),params,
                 params_1);
      local_148 = (bool *)(in_stack_fffffffffffffec8.fmt + 0x1c21);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int64_t)local_148;
}

Assistant:

int64_t CWallet::RescanFromTime(int64_t startTime, const WalletRescanReserver& reserver, bool update)
{
    // Find starting block. May be null if nCreateTime is greater than the
    // highest blockchain timestamp, in which case there is nothing that needs
    // to be scanned.
    int start_height = 0;
    uint256 start_block;
    bool start = chain().findFirstBlockWithTimeAndHeight(startTime - TIMESTAMP_WINDOW, 0, FoundBlock().hash(start_block).height(start_height));
    WalletLogPrintf("%s: Rescanning last %i blocks\n", __func__, start ? WITH_LOCK(cs_wallet, return GetLastBlockHeight()) - start_height + 1 : 0);

    if (start) {
        // TODO: this should take into account failure by ScanResult::USER_ABORT
        ScanResult result = ScanForWalletTransactions(start_block, start_height, /*max_height=*/{}, reserver, /*fUpdate=*/update, /*save_progress=*/false);
        if (result.status == ScanResult::FAILURE) {
            int64_t time_max;
            CHECK_NONFATAL(chain().findBlock(result.last_failed_block, FoundBlock().maxTime(time_max)));
            return time_max + TIMESTAMP_WINDOW + 1;
        }
    }
    return startTime;
}